

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uprops.cpp
# Opt level: O0

UPropertySource uprops_getSource_63(UProperty which)

{
  IntProperty *prop_1;
  BinaryProperty *prop;
  UProperty which_local;
  
  if (which < UCHAR_ALPHABETIC) {
    prop._4_4_ = UPROPS_SRC_NONE;
  }
  else if (which < UCHAR_BINARY_LIMIT) {
    if (binProps[which].mask == 0) {
      prop._4_4_ = binProps[which].column;
    }
    else {
      prop._4_4_ = UPROPS_SRC_PROPSVEC;
    }
  }
  else if (which < UCHAR_BIDI_CLASS) {
    prop._4_4_ = UPROPS_SRC_NONE;
  }
  else if (which < UCHAR_INT_LIMIT) {
    if (intProps[which + 0xfffff000].mask == 0) {
      prop._4_4_ = intProps[which + 0xfffff000].column;
    }
    else {
      prop._4_4_ = UPROPS_SRC_PROPSVEC;
    }
  }
  else if (which < UCHAR_AGE) {
    if ((which | UCHAR_BIDI_CLASS) == UCHAR_DOUBLE_START) {
      prop._4_4_ = UPROPS_SRC_CHAR;
    }
    else {
      prop._4_4_ = UPROPS_SRC_NONE;
    }
  }
  else if (which < UCHAR_STRING_LIMIT) {
    switch(which) {
    case UCHAR_AGE:
      prop._4_4_ = UPROPS_SRC_PROPSVEC;
      break;
    case UCHAR_BIDI_MIRRORING_GLYPH:
      prop._4_4_ = UPROPS_SRC_BIDI;
      break;
    case UCHAR_CASE_FOLDING:
    case UCHAR_LOWERCASE_MAPPING:
    case UCHAR_SIMPLE_CASE_FOLDING:
    case UCHAR_SIMPLE_LOWERCASE_MAPPING:
    case UCHAR_SIMPLE_TITLECASE_MAPPING:
    case UCHAR_SIMPLE_UPPERCASE_MAPPING:
    case UCHAR_TITLECASE_MAPPING:
    case UCHAR_UPPERCASE_MAPPING:
      prop._4_4_ = UPROPS_SRC_CASE;
      break;
    case UCHAR_ISO_COMMENT:
    case UCHAR_NAME:
    case UCHAR_UNICODE_1_NAME:
      prop._4_4_ = UPROPS_SRC_NAMES;
      break;
    default:
      prop._4_4_ = UPROPS_SRC_NONE;
    }
  }
  else if (which == UCHAR_OTHER_PROPERTY_START) {
    prop._4_4_ = UPROPS_SRC_PROPSVEC;
  }
  else {
    prop._4_4_ = UPROPS_SRC_NONE;
  }
  return prop._4_4_;
}

Assistant:

U_CFUNC UPropertySource U_EXPORT2
uprops_getSource(UProperty which) {
    if(which<UCHAR_BINARY_START) {
        return UPROPS_SRC_NONE; /* undefined */
    } else if(which<UCHAR_BINARY_LIMIT) {
        const BinaryProperty &prop=binProps[which];
        if(prop.mask!=0) {
            return UPROPS_SRC_PROPSVEC;
        } else {
            return (UPropertySource)prop.column;
        }
    } else if(which<UCHAR_INT_START) {
        return UPROPS_SRC_NONE; /* undefined */
    } else if(which<UCHAR_INT_LIMIT) {
        const IntProperty &prop=intProps[which-UCHAR_INT_START];
        if(prop.mask!=0) {
            return UPROPS_SRC_PROPSVEC;
        } else {
            return (UPropertySource)prop.column;
        }
    } else if(which<UCHAR_STRING_START) {
        switch(which) {
        case UCHAR_GENERAL_CATEGORY_MASK:
        case UCHAR_NUMERIC_VALUE:
            return UPROPS_SRC_CHAR;

        default:
            return UPROPS_SRC_NONE;
        }
    } else if(which<UCHAR_STRING_LIMIT) {
        switch(which) {
        case UCHAR_AGE:
            return UPROPS_SRC_PROPSVEC;

        case UCHAR_BIDI_MIRRORING_GLYPH:
            return UPROPS_SRC_BIDI;

        case UCHAR_CASE_FOLDING:
        case UCHAR_LOWERCASE_MAPPING:
        case UCHAR_SIMPLE_CASE_FOLDING:
        case UCHAR_SIMPLE_LOWERCASE_MAPPING:
        case UCHAR_SIMPLE_TITLECASE_MAPPING:
        case UCHAR_SIMPLE_UPPERCASE_MAPPING:
        case UCHAR_TITLECASE_MAPPING:
        case UCHAR_UPPERCASE_MAPPING:
            return UPROPS_SRC_CASE;

        case UCHAR_ISO_COMMENT:
        case UCHAR_NAME:
        case UCHAR_UNICODE_1_NAME:
            return UPROPS_SRC_NAMES;

        default:
            return UPROPS_SRC_NONE;
        }
    } else {
        switch(which) {
        case UCHAR_SCRIPT_EXTENSIONS:
            return UPROPS_SRC_PROPSVEC;
        default:
            return UPROPS_SRC_NONE; /* undefined */
        }
    }
}